

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

PrimitiveType
vkt::Draw::anon_unknown_0::mapVkPrimitiveTopology(VkPrimitiveTopology primitiveTopology)

{
  PrimitiveType local_c;
  VkPrimitiveTopology primitiveTopology_local;
  
  switch(primitiveTopology) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
    local_c = PRIMITIVETYPE_POINTS;
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
    local_c = PRIMITIVETYPE_LINES;
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
    local_c = PRIMITIVETYPE_LINE_STRIP;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    local_c = PRIMITIVETYPE_TRIANGLES;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
    local_c = PRIMITIVETYPE_TRIANGLE_STRIP;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    local_c = PRIMITIVETYPE_TRIANGLE_FAN;
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
    local_c = PRIMITIVETYPE_LINES_ADJACENCY;
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    local_c = PRIMITIVETYPE_LINE_STRIP_ADJACENCY;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
    local_c = PRIMITIVETYPE_TRIANGLES_ADJACENCY;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
    local_c = PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY;
    break;
  default:
    local_c = PRIMITIVETYPE_LAST;
  }
  return local_c;
}

Assistant:

rr::PrimitiveType mapVkPrimitiveTopology (vk::VkPrimitiveTopology primitiveTopology)
{
	switch (primitiveTopology)
	{
		case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:						return rr::PRIMITIVETYPE_POINTS;
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:						return rr::PRIMITIVETYPE_LINES;
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:						return rr::PRIMITIVETYPE_LINE_STRIP;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:					return rr::PRIMITIVETYPE_TRIANGLES;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:					return rr::PRIMITIVETYPE_TRIANGLE_FAN;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:					return rr::PRIMITIVETYPE_TRIANGLE_STRIP;
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:		return rr::PRIMITIVETYPE_LINES_ADJACENCY;
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:		return rr::PRIMITIVETYPE_LINE_STRIP_ADJACENCY;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:	return rr::PRIMITIVETYPE_TRIANGLES_ADJACENCY;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:	return rr::PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY;
		default:
			DE_ASSERT(false);
	}
	return rr::PRIMITIVETYPE_LAST;
}